

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          ::hasFastAccess((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                           *)0x1efa32a);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::hasFastAccess
                        ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)0x1efa346);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}